

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> * __thiscall
kratos::FSM::get_all_child_fsm
          (vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *__return_storage_ptr__,FSM *this)

{
  bool bVar1;
  reference ppFVar2;
  reference ppVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar4 [16];
  pair<std::__detail::_Node_iterator<const_kratos::FSM_*,_true,_false>,_bool> pVar5;
  format_args args;
  string_view format_str;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>
  *iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  children;
  string local_178;
  _Node_iterator_base<const_kratos::FSM_*,_false> local_158;
  _Node_iterator_base<const_kratos::FSM_*,_false> local_150;
  value_type local_148;
  FSM *fsm;
  undefined1 local_138 [8];
  unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
  visited;
  undefined1 local_f0 [8];
  queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> queue;
  FSM *this_local;
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
  std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::vector(__return_storage_ptr__);
  std::queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>>::
  queue<std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>,void>
            ((queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>> *)local_f0);
  std::
  unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
  ::unordered_set((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                   *)local_138);
  fsm = this;
  std::queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>>::
  emplace<kratos::FSM*>
            ((queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>> *)local_f0,
             &fsm);
  while( true ) {
    bVar1 = std::queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>::
            empty((queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>
                   *)local_f0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
      std::
      unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
      ::~unordered_set((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                        *)local_138);
      std::queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>::~queue
                ((queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> *
                 )local_f0);
      if ((queue.c.super__Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node._7_1_ & 1) == 0) {
        std::vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppFVar2 = std::queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>
              ::front((queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>
                       *)local_f0);
    local_148 = *ppFVar2;
    std::queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_>::pop
              ((queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> *)
               local_f0);
    std::vector<kratos::FSM*,std::allocator<kratos::FSM*>>::emplace_back<kratos::FSM*&>
              ((vector<kratos::FSM*,std::allocator<kratos::FSM*>> *)__return_storage_ptr__,
               &local_148);
    local_150._M_cur =
         (__node_type *)
         std::
         unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
         ::find((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                 *)local_138,&local_148);
    local_158._M_cur =
         (__node_type *)
         std::
         unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
         ::end((unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
                *)local_138);
    bVar1 = std::__detail::operator!=(&local_150,&local_158);
    if (bVar1) break;
    pVar5 = std::
            unordered_set<kratos::FSM_const*,std::hash<kratos::FSM_const*>,std::equal_to<kratos::FSM_const*>,std::allocator<kratos::FSM_const*>>
            ::emplace<kratos::FSM*&>
                      ((unordered_set<kratos::FSM_const*,std::hash<kratos::FSM_const*>,std::equal_to<kratos::FSM_const*>,std::allocator<kratos::FSM_const*>>
                        *)local_138,&local_148);
    children._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)pVar5.first.super__Node_iterator_base<const_kratos::FSM_*,_false>._M_cur;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
           *)&__range2,&local_148->child_fsms_);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
                      *)&__range2);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
                     *)&__range2);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&iter);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>
               ::operator*(&__end2);
      std::queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>>::
      emplace<kratos::FSM*const&>
                ((queue<kratos::FSM*,std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>> *)
                 local_f0,&ppVar3->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
            *)&__range2);
  }
  auVar4 = __cxa_allocate_exception(0x10);
  local_38 = &local_178;
  local_40 = "FSM {0} has circular dependency";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[32],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"FSM {0} has circular dependency",(v7 *)this,auVar4._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "FSM {0} has circular dependency");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&result;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  format_str.size_ = (size_t)result;
  format_str.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_178,(detail *)local_78.data_,format_str,args);
  UserException::UserException(auVar4._0_8_,&local_178);
  __cxa_throw(auVar4._0_8_,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::vector<FSM*> FSM::get_all_child_fsm() const {
    std::vector<FSM*> result;
    std::queue<FSM*> queue;
    std::unordered_set<const FSM*> visited;
    queue.emplace(const_cast<FSM*>(this));
    while (!queue.empty()) {
        auto* fsm = queue.front();
        queue.pop();
        result.emplace_back(fsm);
        if (visited.find(fsm) != visited.end())
            throw UserException(::format("FSM {0} has circular dependency", fsm_name_));

        visited.emplace(fsm);
        auto children = fsm->child_fsms_;
        for (auto const& iter : children) queue.emplace(iter.second);
    }
    return result;
}